

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reddit.h
# Opt level: O0

vector<Comment,_std::allocator<Comment>_> * __thiscall Reddit::requestNewComments(Reddit *this)

{
  bool bVar1;
  back_insert_iterator<std::vector<Comment,_std::allocator<Comment>_>_> __lhs;
  iterator data;
  __normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_> in_RSI;
  Reddit *in_RDI;
  Comment *comment;
  iterator __end1;
  iterator __begin1;
  vector<Comment,_std::allocator<Comment>_> *__range1;
  __normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_> pos;
  vector<Comment,_std::allocator<Comment>_> allComments;
  vector<Comment,_std::allocator<Comment>_> *filteredComments;
  Comment *in_stack_ffffffffffffff08;
  back_insert_iterator<std::vector<Comment,_std::allocator<Comment>_>_> __result;
  __normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_> __last;
  string local_b8 [32];
  reference local_98;
  Comment *local_90;
  Reddit *this_00;
  Reddit *in_stack_ffffffffffffff88;
  
  __last._M_current = (Comment *)&stack0xffffffffffffffd8;
  __result.container = (vector<Comment,_std::allocator<Comment>_> *)in_RDI;
  requestComments(in_stack_ffffffffffffff88);
  std::vector<Comment,_std::allocator<Comment>_>::begin
            ((vector<Comment,_std::allocator<Comment>_> *)in_stack_ffffffffffffff08);
  std::vector<Comment,_std::allocator<Comment>_>::end
            ((vector<Comment,_std::allocator<Comment>_> *)in_stack_ffffffffffffff08);
  std::
  partition<__gnu_cxx::__normal_iterator<Comment*,std::vector<Comment,std::allocator<Comment>>>,Reddit::requestNewComments()::_lambda(Comment_const&)_1_>
            (in_RSI,__last,(anon_class_8_1_8991fb9c)__result.container);
  std::vector<Comment,_std::allocator<Comment>_>::vector
            ((vector<Comment,_std::allocator<Comment>_> *)0x11a37a);
  std::vector<Comment,_std::allocator<Comment>_>::begin
            ((vector<Comment,_std::allocator<Comment>_> *)in_stack_ffffffffffffff08);
  std::back_inserter<std::vector<Comment,std::allocator<Comment>>>
            ((vector<Comment,_std::allocator<Comment>_> *)in_stack_ffffffffffffff08);
  __lhs = std::
          move<__gnu_cxx::__normal_iterator<Comment*,std::vector<Comment,std::allocator<Comment>>>,std::back_insert_iterator<std::vector<Comment,std::allocator<Comment>>>>
                    (in_RSI,__last,__result);
  this_00 = in_RDI;
  data = std::vector<Comment,_std::allocator<Comment>_>::begin(in_stack_ffffffffffffff08);
  local_90 = (Comment *)
             std::vector<Comment,_std::allocator<Comment>_>::end
                       ((vector<Comment,_std::allocator<Comment>_> *)in_stack_ffffffffffffff08);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>
                             *)__lhs.container,
                            (__normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>
                             *)in_stack_ffffffffffffff08), bVar1) {
    in_stack_ffffffffffffff08 = in_RSI._M_current;
    local_98 = __gnu_cxx::
               __normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>::
               operator*((__normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>
                          *)&stack0xffffffffffffff78);
    in_RSI._M_current = in_stack_ffffffffffffff08;
    std::__cxx11::string::string(local_b8,(string *)local_98);
    Cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::add
              (&this_00->commentCache,&(data._M_current)->id);
    std::__cxx11::string::~string(local_b8);
    __gnu_cxx::__normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>::
    operator++((__normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_> *)
               &stack0xffffffffffffff78);
  }
  std::vector<Comment,_std::allocator<Comment>_>::~vector
            ((vector<Comment,_std::allocator<Comment>_> *)in_RDI);
  return __result.container;
}

Assistant:

std::vector<Comment> requestNewComments() {
			std::vector<Comment> allComments = requestComments();

			const auto pos = std::partition(allComments.begin(), allComments.end(), [&](const Comment& c) {
				return (c.author != "std_bot") and !commentCache.isKnown(c.id);
			});

			std::vector<Comment> filteredComments;
			std::move(allComments.begin(), pos, std::back_inserter(filteredComments));

			for (const Comment& comment : filteredComments) {
				commentCache.add(comment.id);
			}

			return filteredComments;
		}